

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O1

int json_cfg_encode_keep_buffer(lua_State *l)

{
  int iVar1;
  json_config_t *pjVar2;
  char **in_RCX;
  int in_R8D;
  
  pjVar2 = json_arg_init(l,1);
  iVar1 = pjVar2->encode_keep_buffer;
  json_enum_option(l,(int)pjVar2 + 0x538,(int *)0x0,in_RCX,in_R8D);
  if (iVar1 != pjVar2->encode_keep_buffer) {
    if (pjVar2->encode_keep_buffer == 0) {
      strbuf_free(&pjVar2->encode_buf);
    }
    else {
      strbuf_init(&pjVar2->encode_buf,0);
    }
  }
  return 1;
}

Assistant:

static int json_cfg_encode_keep_buffer(lua_State *l)
{
    json_config_t *cfg = json_arg_init(l, 1);
    int old_value;

    old_value = cfg->encode_keep_buffer;

    json_enum_option(l, 1, &cfg->encode_keep_buffer, NULL, 1);

    /* Init / free the buffer if the setting has changed */
    if (old_value ^ cfg->encode_keep_buffer) {
        if (cfg->encode_keep_buffer)
            strbuf_init(&cfg->encode_buf, 0);
        else
            strbuf_free(&cfg->encode_buf);
    }

    return 1;
}